

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

int __thiscall ON_Material::DeleteTexture(ON_Material *this,wchar_t *filename,TYPE type)

{
  int iVar1;
  ON_wString *this_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = (this->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
  if (type == no_texture_type && filename == (wchar_t *)0x0) {
    ON_ClassArray<ON_Texture>::Destroy(&(this->m_textures).super_ON_ClassArray<ON_Texture>);
  }
  else {
    uVar2 = uVar3;
    uVar4 = uVar3;
    uVar3 = 0;
    while (uVar2 = uVar2 - 1, 0 < (int)uVar4) {
      if ((type == no_texture_type) ||
         ((this->m_textures).super_ON_ClassArray<ON_Texture>.m_a[uVar2].m_type == type)) {
        if (filename != (wchar_t *)0x0) {
          this_00 = ON_FileReference::FullPath
                              (&(this->m_textures).super_ON_ClassArray<ON_Texture>.m_a[uVar2].
                                m_image_file_reference);
          iVar1 = ON_wString::ComparePath(this_00,filename);
          if (iVar1 != 0) goto LAB_004ee178;
        }
        ON_ClassArray<ON_Texture>::Remove
                  (&(this->m_textures).super_ON_ClassArray<ON_Texture>,uVar4 - 1);
        uVar3 = uVar3 + 1;
        uVar4 = uVar2;
      }
      else {
LAB_004ee178:
        uVar4 = uVar4 - 1;
      }
    }
  }
  return uVar3;
}

Assistant:

int ON_Material::DeleteTexture(const wchar_t* filename,ON_Texture::TYPE type )
{
  int deleted_count = 0;
  int i;

  if ( !filename && type == ON_Texture::TYPE::no_texture_type )
  {
    deleted_count = m_textures.Count();
    m_textures.Destroy();
  }
  else
  {
    for ( i = m_textures.Count()-1; i >= 0; i--)
    {
      if ( type != ON_Texture::TYPE::no_texture_type && type != m_textures[i].m_type )
        continue;
      if ( filename && m_textures[i].m_image_file_reference.FullPath().ComparePath(filename) )
        continue;
      m_textures.Remove(i);
      deleted_count++;
    }
  }
  return deleted_count;
}